

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<void> __thiscall kj::HttpServer::listenHttp(HttpServer *this,ConnectionReceiver *port)

{
  SourceLocation location;
  undefined1 local_38 [16];
  char *local_28;
  char *pcStack_20;
  undefined8 local_18;
  
  listenLoop((HttpServer *)(local_38 + 8),port);
  ForkedPromise<void>::addBranch((ForkedPromise<void> *)local_38);
  local_28 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  pcStack_20 = "listenHttp";
  local_18 = 0xa00001fda;
  location.function = "listenHttp";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x1fda;
  location.columnNumber = 10;
  Promise<void>::exclusiveJoin((Promise<void> *)this,(Promise<void> *)(local_38 + 8),location);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_38);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(local_38 + 8));
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> HttpServer::listenHttp(kj::ConnectionReceiver& port) {
  return listenLoop(port).exclusiveJoin(onDrain.addBranch());
}